

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

Vec4 __thiscall
tcu::TextureCubeView::sample
          (TextureCubeView *this,Sampler *sampler,float s,float t,float r,float lod)

{
  CubeFace face;
  ulong uVar1;
  float s_00;
  Sampler *in_RDX;
  undefined1 auVar4 [12];
  undefined8 uVar5;
  Vec4 VVar2;
  CubeFaceFloatCoords CVar3;
  ulong local_58;
  float local_50;
  Vector<float,_3> local_48;
  undefined8 local_3c;
  CubeFaceFloatCoords coords;
  float lod_local;
  float r_local;
  float t_local;
  float s_local;
  Sampler *sampler_local;
  TextureCubeView *this_local;
  
  coords.s = lod;
  coords.t = r;
  Vector<float,_3>::Vector(&local_48,s,t,r);
  CVar3 = getCubeFaceCoords(&local_48);
  local_58 = CVar3._0_8_;
  local_3c = local_58;
  uVar1 = local_3c;
  local_50 = CVar3.t;
  coords.face = (CubeFace)local_50;
  local_3c._0_4_ = CVar3.face;
  face = (CubeFace)local_3c;
  local_3c._4_4_ = CVar3.s;
  s_00 = local_3c._4_4_;
  local_3c = uVar1;
  if ((in_RDX->seamlessCubeMap & 1U) == 0) {
    VVar2 = sampleLevelArray2D((tcu *)this,
                               *(ConstPixelBufferAccess **)
                                (&sampler->wrapR + (local_58 & 0xffffffff) * 2),sampler->wrapS,
                               in_RDX,s_00,local_50,0,coords.s);
  }
  else {
    VVar2 = sampleLevelArrayCubeSeamless
                      ((tcu *)this,(ConstPixelBufferAccess *(*) [6])&sampler->wrapR,sampler->wrapS,
                       face,in_RDX,s_00,local_50,0,coords.s);
  }
  VVar2.m_data[0] = VVar2.m_data[0];
  auVar4._4_4_ = VVar2.m_data[1];
  register0x00001240 = VVar2.m_data[2];
  register0x00001244 = VVar2.m_data[3];
  return (Vec4)VVar2.m_data;
}

Assistant:

tcu::Vec4 TextureCubeView::sample (const Sampler& sampler, float s, float t, float r, float lod) const
{
	DE_ASSERT(sampler.compare == Sampler::COMPAREMODE_NONE);

	// Computes (face, s, t).
	const CubeFaceFloatCoords coords = getCubeFaceCoords(Vec3(s, t, r));
	if (sampler.seamlessCubeMap)
		return sampleLevelArrayCubeSeamless(m_levels, m_numLevels, coords.face, sampler, coords.s, coords.t, 0 /* depth */, lod);
	else
		return sampleLevelArray2D(m_levels[coords.face], m_numLevels, sampler, coords.s, coords.t, 0 /* depth */, lod);
}